

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O1

void __thiscall
prevector_tests::prevector_tester<8U,_int>::insert
          (prevector_tester<8U,_int> *this,Size position,int *value)

{
  long lVar1;
  pretype *ppVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::insert
            (&this->real_vector,
             (const_iterator)
             ((this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + position),value);
  ppVar2 = &this->pre_vector;
  if (8 < (this->pre_vector)._size) {
    ppVar2 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
  }
  prevector<8U,_int,_unsigned_int,_int>::insert
            (&this->pre_vector,(int *)((long)&ppVar2->_union + (ulong)position * 4),value);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    test(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(Size position, const T& value) {
        real_vector.insert(real_vector.begin() + position, value);
        pre_vector.insert(pre_vector.begin() + position, value);
        test();
    }